

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::check_load_fromPostsolve(HModel *this)

{
  bool bVar1;
  HModel *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  HModel *in_stack_00000008;
  bool ok;
  
  bVar1 = nonbasicFlagBasicIndex_OK(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  printf("HModel::check_load_fromPostsolve: return from nonbasicFlagBasicIndex_OK = %d\n",
         (ulong)bVar1);
  bVar1 = allNonbasicMoveVsWorkArrays_OK(in_RDI);
  printf("HModel::check_load_fromPostsolve: return from allNonbasicMoveVsWorkArrays_OK = %d\n",
         (ulong)bVar1);
  return;
}

Assistant:

void HModel::check_load_fromPostsolve() {
  //  printf("Checking load_fromPostsolve\n");
  bool ok;
  ok = nonbasicFlagBasicIndex_OK(numCol, numRow);
  printf("HModel::check_load_fromPostsolve: return from nonbasicFlagBasicIndex_OK = %d\n", ok);
  assert(ok);
  ok = allNonbasicMoveVsWorkArrays_OK();
  printf("HModel::check_load_fromPostsolve: return from allNonbasicMoveVsWorkArrays_OK = %d\n", ok);
  assert(ok);
}